

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O2

int mk_stream_in_release(mk_stream_input *in)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  
  if (in->cb_finished != (_func_void_mk_stream_input_ptr *)0x0) {
    (*in->cb_finished)(in);
  }
  pmVar1 = (in->_head).prev;
  pmVar2 = (in->_head).next;
  pmVar1->next = pmVar2;
  pmVar2->prev = pmVar1;
  (in->_head).prev = (mk_list *)0x0;
  (in->_head).next = (mk_list *)0x0;
  if (in->dynamic == 1) {
    free(in);
  }
  return 0;
}

Assistant:

int mk_stream_in_release(struct mk_stream_input *in)
{
    if (in->cb_finished) {
        in->cb_finished(in);
    }

    mk_stream_input_unlink(in);
    if (in->dynamic == MK_TRUE) {
        mk_mem_free(in);
    }

    return 0;
}